

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O1

void crotg(complex<float> *ca,complex<float> cb,float *c,complex<float> *s)

{
  double dVar1;
  complex<float> z;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float in_XMM0_Db;
  undefined8 uVar6;
  float fVar7;
  undefined8 local_68;
  complex<float> cb_local;
  
  z._M_value = (_ComplexT_conflict)ca;
  fVar2 = cabs2((complex<float>)ca);
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    fVar2 = cabs2(z);
    fVar3 = cabs2(z);
    fVar4 = cabs2(z);
    fVar5 = cabs2(z);
    dVar1 = (double)fVar5 * (double)fVar5 + (double)fVar4 * (double)fVar4;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    fVar2 = (float)(dVar1 * (double)(fVar3 + fVar2));
    fVar3 = cabs2(z);
    fVar4 = (float)(ca->_M_value >> 0x20);
    fVar5 = (float)ca->_M_value / fVar3;
    fVar3 = fVar4 / fVar3;
    local_68 = CONCAT44(fVar4,fVar3);
    fVar4 = cabs2(z);
    *(float *)cb._M_value = fVar4 / fVar2;
    fVar4 = in_XMM0_Db * fVar3 + in_XMM0_Da * fVar5;
    fVar7 = in_XMM0_Da * fVar3 - in_XMM0_Db * fVar5;
    uVar6 = CONCAT44(fVar7,fVar4);
    if ((NAN(fVar4)) && (uVar6 = CONCAT44(fVar7,fVar4), NAN(fVar7))) {
      uVar6 = __mulsc3(fVar5,local_68,in_XMM0_Da,-in_XMM0_Db);
      local_68 = (ulong)(uint)fVar3;
    }
    *(ulong *)c = CONCAT44((float)((ulong)uVar6 >> 0x20) / fVar2,(float)uVar6 / fVar2);
    in_XMM0_Da = fVar5 * fVar2;
    in_XMM0_Db = (float)local_68 * fVar2;
  }
  else {
    *(undefined4 *)cb._M_value = 0;
    c[0] = 1.0;
    c[1] = 0.0;
  }
  ca->_M_value = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  return;
}

Assistant:

void crotg ( complex <float> *ca, complex <float> cb, float *c,
  complex <float> *s )

//****************************************************************************80
//
//  Purpose:
//
//    CROTG determines a Givens rotation.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//    Given values A and B, this routine computes:
//
//    If A = 0:
//
//      R = B
//      C = 0
//      S = (1,0).
//
//    If A /= 0:
//
//      ALPHA = A / abs ( A )
//      NORM  = sqrt ( ( abs ( A ) )**2 + ( abs ( B ) )**2 )
//      R     = ALPHA * NORM
//      C     = abs ( A ) / NORM
//      S     = ALPHA * conj ( B ) / NORM
//
//    In either case, the computed numbers satisfy the equation:
//
//    (         C    S ) * ( A ) = ( R )
//    ( -conj ( S )  C )   ( B ) = ( 0 )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    31 March 2007
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input/output, complex <float> *CA, on input, the value A.  On output,
//    the value R.
//
//    Input, complex <float> CB, the value B.
//
//    Output, float *C, the cosine of the Given rotation.
//
//    Output, complex <float> *S, the sine of the Givens rotation.
//
{
  complex <float> alpha;
  float norm;
  float scale;

  if ( cabs2 ( *ca ) == 0.0 )
  {
    *c = 0.0;
    *s = complex <float> ( 1.0, 0.0 );
    *ca = cb;
  }
  else
  {
    scale = cabs2 ( *ca ) + cabs2 ( cb );
    norm = scale * sqrt ( pow ( cabs2 ( *ca / scale ), 2 )
                        + pow ( cabs2 (  cb / scale ), 2 ) );
    alpha = *ca / cabs2 ( *ca );
    *c = cabs2 ( *ca ) / norm;
    *s = alpha * conj ( cb ) / norm;
    *ca = alpha * norm;
  }

  return;
}